

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigIntInherited.cpp
# Opt level: O1

ostream * operator<<(ostream *os,BigIntInherited *obj)

{
  ostream *poVar1;
  BigInt BStack_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"\x1b[0;",4);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,obj->_color);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"m",1);
  BigInt::BigInt(&BStack_38,&obj->super_BigInt);
  operator<<(os,&BStack_38);
  BigInt::~BigInt(&BStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\x1b[0;",4);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,0x1e);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"m",1);
  return os;
}

Assistant:

ostream &operator<<(ostream &os, const BigIntInherited &obj)
{
    os << "\033[0;" << obj._color << "m";
    os << (BigInt) obj;
    os << "\033[0;" << 30 << "m";
    return os;
}